

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void pulse_prog_steal(OBJ_DATA *obj,bool isTick)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte in_SIL;
  OBJ_DATA *in_RDI;
  int i;
  OBJ_DATA *unaff_retaddr;
  int invnum;
  bool dbreak;
  OBJ_DATA *stolen;
  CHAR_DATA *ch;
  CHAR_DATA *vch;
  int in_stack_000001f4;
  CHAR_DATA *in_stack_000001f8;
  CHAR_DATA *in_stack_00000200;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar5;
  int in_stack_ffffffffffffffd0;
  uint3 in_stack_ffffffffffffffd4;
  uint uVar6;
  CHAR_DATA *ch_00;
  CHAR_DATA *ch_01;
  CHAR_DATA *local_18;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  ch_01 = in_RDI->carried_by;
  ch_00 = (CHAR_DATA *)0x0;
  uVar6 = (uint)in_stack_ffffffffffffffd4;
  iVar3 = number_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar5 = 0;
  if (((ch_01 != (CHAR_DATA *)0x0) && (bVar2 = is_worn(in_RDI), bVar2)) && (ch_01->position == 8)) {
    for (local_18 = ch_01->in_room->people; local_18 != (CHAR_DATA *)0x0;
        local_18 = local_18->next_in_room) {
      iVar4 = number_percent();
      if ((0x61 < iVar4) && (local_18 != ch_01)) {
        for (ch_00 = (CHAR_DATA *)local_18->carrying; ch_00 != (CHAR_DATA *)0x0;
            ch_00 = ch_00->next_in_room) {
          if (((ch_00->version == -1) && (bVar2 = can_see_obj(_invnum,unaff_retaddr), bVar2)) &&
             ((iVar3 == iVar5 || (ch_00->next_in_room == (CHAR_DATA *)0x0)))) {
            uVar6 = CONCAT13(1,(int3)uVar6);
            break;
          }
          iVar5 = iVar5 + 1;
        }
        if ((uVar6 & 0x1000000) != 0) break;
      }
    }
    if ((ch_00 != (CHAR_DATA *)0x0) && (local_18 != (CHAR_DATA *)0x0)) {
      send_to_char((char *)ch_01,ch_00);
      act((char *)ch_01,ch_00,(void *)CONCAT44(uVar6,iVar3),
          (void *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),0);
      iVar4 = number_percent();
      if ((iVar4 < 0x60) || (local_18->position == 4)) {
        obj_from_char((OBJ_DATA *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
        obj_to_char((OBJ_DATA *)CONCAT44(uVar6,iVar3),
                    (CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
      }
      else {
        do_myell(ch_01,(char *)ch_00,(CHAR_DATA *)CONCAT44(uVar6,iVar3));
        send_to_char((char *)ch_01,ch_00);
        multi_hit(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_steal(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *vch, *ch = obj->carried_by;
	OBJ_DATA *stolen = nullptr;
	bool dbreak= false;
	int invnum = number_range(0, 5), i = 0;

	if (!ch || !is_worn(obj) || ch->position != POS_STANDING)
		return;

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (number_percent() < 98 || vch == ch)
			continue;

		for (stolen = vch->carrying; stolen != nullptr; stolen = stolen->next_content)
		{
			if (stolen->wear_loc == WEAR_NONE && (can_see_obj(ch, stolen)) && (invnum == i || !stolen->next_content))
			{
				dbreak = true;
				break;
			}

			i++;
		}

		if (dbreak)
			break;
	}

	if (!stolen || !vch)
		return;

	send_to_char("You grin evilly as a sudden urge takes hold of you.\n\r", ch);
	act("Slipping into $N's pockets, you carefully slide $p out.", ch, stolen, vch, TO_CHAR);

	if (number_percent() > 95 && vch->position != POS_SLEEPING)
	{
		do_myell(vch, "Keep your hands out of there!", ch);
		send_to_char("Oops.\n\r", ch);
		multi_hit(vch, ch, TYPE_UNDEFINED);
		return;
	}

	obj_from_char(stolen);
	obj_to_char(stolen, ch);
}